

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

int ma_dr_mp3dec_decode_frame
              (ma_dr_mp3dec *dec,ma_uint8 *mp3,int mp3_bytes,void *pcm,ma_dr_mp3dec_frame_info *info
              )

{
  long *plVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  ushort uVar6;
  short sVar7;
  short sVar8;
  undefined2 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  ma_dr_mp3d_sample_t *pmVar40;
  ma_dr_mp3dec_frame_info *pmVar41;
  byte bVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  ma_uint32 mVar47;
  ma_uint32 mVar48;
  ma_uint32 mVar49;
  ma_uint8 *pmVar50;
  undefined4 extraout_var;
  long lVar51;
  uint *puVar52;
  undefined8 uVar53;
  byte bVar54;
  byte bVar55;
  uint uVar56;
  long lVar57;
  long lVar58;
  float *pfVar59;
  float *pfVar60;
  bool bVar61;
  char cVar62;
  uint uVar63;
  float *pfVar64;
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  uint uVar68;
  uint uVar69;
  undefined1 *puVar70;
  undefined4 *puVar71;
  float *pfVar72;
  float *pfVar73;
  undefined1 *puVar74;
  float *pfVar75;
  float (*overlap) [288];
  byte bVar76;
  ma_uint8 *codebook_count1;
  ulong uVar77;
  uint uVar78;
  uint uVar79;
  uint *puVar80;
  uint uVar81;
  ulong uVar82;
  int iVar83;
  int iVar84;
  uint uVar85;
  ulong uVar86;
  int iVar87;
  byte *pbVar88;
  long *plVar89;
  byte bVar90;
  bool bVar91;
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  undefined1 in_XMM1 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar96;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  ma_uint8 scf_size [4];
  ma_dr_mp3_bs bs_frame [1];
  float tmp [18];
  ma_dr_mp3dec_scratch scratch;
  ulong local_43f8;
  ulong local_43d8;
  ulong local_43a8;
  byte local_439c [4];
  ma_dr_mp3_bs local_4398;
  ma_uint8 *local_4380;
  ma_uint8 *local_4378;
  ma_uint8 *local_4370;
  ulong local_4368;
  ma_dr_mp3d_sample_t *local_4360;
  ma_dr_mp3dec_frame_info *local_4358;
  float *local_4350;
  undefined4 local_4344;
  float *local_4340;
  undefined4 local_4338;
  float fStack_4334;
  undefined4 local_4330;
  byte local_4038;
  byte local_4037;
  byte local_4036 [64];
  byte abStack_3ff6 [70];
  ma_dr_mp3_bs local_3fb0;
  ma_uint8 local_3fa0 [2816];
  long local_34a0;
  ushort local_3498 [3];
  byte local_3492;
  undefined2 local_3491;
  byte local_348f [5];
  undefined2 local_348a;
  byte local_3488 [20];
  undefined2 auStack_3474 [42];
  float local_3420 [4];
  float afStack_3410 [572];
  undefined1 local_2b20 [16];
  float afStack_2b10 [572];
  float local_2220 [40];
  float local_2180 [2112];
  undefined1 local_80 [39];
  byte local_59 [41];
  
  bVar42 = 0;
  local_4360 = (ma_dr_mp3d_sample_t *)pcm;
  local_4358 = info;
  if (mp3_bytes < 5) {
    memset(dec,0,0x1a0c);
    iVar43 = mp3_bytes;
  }
  else {
    local_4370 = dec->header;
    local_4380 = mp3;
    if ((dec->header[0] == 0xff) && (iVar43 = ma_dr_mp3_hdr_compare(local_4370,mp3), iVar43 != 0)) {
      bVar76 = local_4380[1];
      bVar55 = local_4380[2];
      iVar44 = ma_dr_mp3_hdr_frame_bytes((ma_uint8 *)(ulong)bVar76,(uint)bVar55);
      iVar43 = 0;
      iVar84 = (uint)((~bVar76 & 6) == 0) * 3 + 1;
      if ((bVar55 & 2) == 0) {
        iVar84 = 0;
      }
      uVar56 = iVar84 + iVar44;
      local_43d8._0_4_ = mp3_bytes;
      if ((uVar56 == mp3_bytes) ||
         (((int)(uVar56 + 4) <= mp3_bytes &&
          (iVar84 = ma_dr_mp3_hdr_compare(local_4380,local_4380 + (int)uVar56),
          local_43d8._0_4_ = uVar56, uVar56 != 0 && iVar84 != 0)))) {
LAB_001586ff:
        pmVar50 = local_4380 + iVar43;
        local_4398.buf = pmVar50 + 4;
        *(undefined4 *)local_4370 = *(undefined4 *)pmVar50;
        local_4358->frame_bytes = iVar43 + (uint)local_43d8;
        uVar56 = (pmVar50[3] < 0xc0) + 1;
        local_4368 = (ulong)uVar56;
        local_4358->channels = uVar56;
        local_4358->hz =
             (*(uint *)(ma_dr_mp3_hdr_sample_rate_hz(unsigned_char_const*)::g_hz +
                       (pmVar50[2] & 0xc)) >> ((pmVar50[1] & 8) == 0)) >> ((pmVar50[1] & 0x10) == 0)
        ;
        uVar56 = pmVar50[1] >> 1 & 3;
        local_4358->layer = 4 - uVar56;
        local_4358->bitrate_kbps =
             (uint)(byte)ma_dr_mp3_hdr_bitrate_kbps(unsigned_char_const*)::halfrate
                         [(ulong)(pmVar50[2] >> 4) +
                          (long)(int)((pmVar50[1] >> 1 & 3) - 1) * 0xf +
                          (ulong)(pmVar50[1] >> 3 & 1) * 0x2d] * 2;
        local_4398.pos = 0;
        local_4398.limit = (uint)local_43d8 * 8 + -0x20;
        bVar76 = pmVar50[1];
        if ((bVar76 & 1) == 0) {
          ma_dr_mp3_bs_get_bits(&local_4398,0x10);
        }
        pmVar50 = local_4380 + iVar43;
        if ((char)uVar56 == '\x01') {
          bVar55 = pmVar50[3];
          mVar48 = 0;
          uVar56 = (bVar55 < 0xc0) + 1;
          iVar43 = ((bVar76 >> 3 & 1) + (uint)((bVar76 >> 4 & 1) != 0)) * 3 + (pmVar50[2] >> 2 & 3);
          local_4380 = pmVar50;
          if ((bVar76 & 8) == 0) {
            mVar47 = ma_dr_mp3_bs_get_bits(&local_4398,uVar56 | 8);
            local_4378 = (ma_uint8 *)(ulong)(mVar47 >> (sbyte)uVar56);
            uVar81 = uVar56;
          }
          else {
            uVar81 = uVar56 * 2;
            mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,9);
            local_4378 = (ma_uint8 *)CONCAT44(extraout_var,mVar48);
            mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,uVar56 * 2 + 7);
          }
          lVar57 = (long)(int)(iVar43 + -1 + (uint)(iVar43 == 0));
          iVar43 = 0;
          pbVar88 = local_3488 + 7;
          do {
            uVar56 = mVar48 << 4;
            if (bVar55 < 0xc0) {
              uVar56 = mVar48;
            }
            uVar67 = (ulong)uVar56;
            mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,0xc);
            *(short *)(pbVar88 + -0x17) = (short)mVar48;
            mVar47 = ma_dr_mp3_bs_get_bits(&local_4398,9);
            *(short *)(pbVar88 + -0x15) = (short)mVar47;
            if (0x120 < (mVar47 & 0xffff)) goto LAB_00158b97;
            mVar47 = ma_dr_mp3_bs_get_bits(&local_4398,8);
            pbVar88[-0x11] = (byte)mVar47;
            mVar47 = ma_dr_mp3_bs_get_bits(&local_4398,(uint)((bVar76 & 8) == 0) * 5 + 4);
            *(short *)(pbVar88 + -0x13) = (short)mVar47;
            *(undefined1 **)(pbVar88 + -0x1f) =
                 ma_dr_mp3_L3_read_side_info(ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info*,unsigned_char_const*)
                 ::g_scf_long + lVar57 * 0x17;
            pbVar88[-0xe] = 0x16;
            pbVar88[-0xd] = 0;
            mVar47 = ma_dr_mp3_bs_get_bits(&local_4398,1);
            if (mVar47 == 0) {
              pbVar88[-0x10] = 0;
              pbVar88[-0xf] = 0;
              mVar47 = ma_dr_mp3_bs_get_bits(&local_4398,0xf);
              mVar49 = ma_dr_mp3_bs_get_bits(&local_4398,4);
              pbVar88[-9] = (byte)mVar49;
              mVar49 = ma_dr_mp3_bs_get_bits(&local_4398,3);
              pbVar88[-8] = (byte)mVar49;
              pbVar88[-7] = 0xff;
            }
            else {
              mVar47 = ma_dr_mp3_bs_get_bits(&local_4398,2);
              pbVar88[-0x10] = (byte)mVar47;
              if ((byte)mVar47 == 0) goto LAB_00158b97;
              mVar47 = ma_dr_mp3_bs_get_bits(&local_4398,1);
              pbVar88[-0xf] = (byte)mVar47;
              pbVar88[-9] = 7;
              pbVar88[-8] = 0xff;
              if (pbVar88[-0x10] == 2) {
                bVar54 = 0x1e;
                puVar70 = ma_dr_mp3_L3_read_side_info(ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info*,unsigned_char_const*)
                          ::g_scf_mixed;
                bVar90 = ((bVar76 & 8) >> 2) + 6;
                if ((byte)mVar47 == 0) {
                  pbVar88[-9] = 8;
                  bVar54 = 0x27;
                  bVar90 = 0;
                  puVar70 = ma_dr_mp3_L3_read_side_info(ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info*,unsigned_char_const*)
                            ::g_scf_short;
                }
                uVar67 = (ulong)(uVar56 & 0xf0f);
                *(undefined1 **)(pbVar88 + -0x1f) = puVar70 + lVar57 * 0x28;
                pbVar88[-0xe] = bVar90;
                pbVar88[-0xd] = bVar54;
              }
              mVar47 = ma_dr_mp3_bs_get_bits(&local_4398,10);
              mVar47 = mVar47 << 5;
              mVar49 = ma_dr_mp3_bs_get_bits(&local_4398,3);
              pbVar88[-6] = (byte)mVar49;
              mVar49 = ma_dr_mp3_bs_get_bits(&local_4398,3);
              pbVar88[-5] = (byte)mVar49;
              mVar49 = ma_dr_mp3_bs_get_bits(&local_4398,3);
              pbVar88[-4] = (byte)mVar49;
            }
            pbVar88[-0xc] = (byte)(mVar47 >> 10);
            pbVar88[-0xb] = (byte)(mVar47 >> 5) & 0x1f;
            pbVar88[-10] = (byte)mVar47 & 0x1f;
            if ((bVar76 & 8) == 0) {
              bVar90 = 499 < *(ushort *)(pbVar88 + -0x13);
            }
            else {
              mVar47 = ma_dr_mp3_bs_get_bits(&local_4398,1);
              bVar90 = (byte)mVar47;
            }
            iVar43 = iVar43 + (mVar48 & 0xffff);
            pbVar88[-3] = bVar90;
            mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,1);
            pbVar88[-2] = (byte)mVar48;
            mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,1);
            iVar84 = local_4398.pos;
            pbVar88[-1] = (byte)mVar48;
            *pbVar88 = (byte)(uVar67 >> 0xc) & 0xf;
            mVar48 = (int)uVar67 << 4;
            pbVar88 = pbVar88 + 0x20;
            uVar81 = uVar81 - 1;
          } while (uVar81 != 0);
          iVar44 = (int)local_4378;
          iVar83 = local_4398.limit - local_4398.pos;
          if ((local_4398.limit < local_4398.pos || iVar44 < 0) ||
              local_4398.limit + iVar44 * 8 < iVar43 + local_4398.pos) {
LAB_00158b97:
            *local_4370 = '\0';
            return 0;
          }
          iVar43 = dec->reserv;
          iVar87 = iVar44;
          if (iVar43 < iVar44) {
            iVar87 = iVar43;
          }
          uVar56 = 0;
          uVar67 = (ulong)(uint)(iVar43 - iVar44);
          if (iVar43 - iVar44 < 1) {
            uVar67 = 0;
          }
          iVar46 = iVar83 + 7;
          if (-1 < iVar83) {
            iVar46 = iVar83;
          }
          memcpy(local_3fa0,dec->reserv_buf + uVar67,(long)iVar87);
          iVar83 = iVar84 + 7;
          if (-1 < iVar84) {
            iVar83 = iVar84;
          }
          memcpy(local_3fa0 + iVar87,local_4398.buf + (iVar83 >> 3),(long)(iVar46 >> 3));
          local_3fb0.pos = 0;
          local_3fb0.limit = ((iVar46 >> 3) + iVar87) * 8;
          local_3fb0.buf = local_3fa0;
          if ((local_4360 != (ma_dr_mp3d_sample_t *)0x0) && ((int)local_4378 <= iVar43)) {
            local_4340 = dec->qmf_state;
            iVar84 = 0;
            uVar53 = CONCAT71((int7)((ulong)local_4340 >> 8),1);
            uVar67 = local_4368;
            do {
              local_4344 = (undefined4)uVar53;
              memset(local_3420,0,0x1200);
              lVar57 = (long)(iVar84 * (int)uVar67);
              lVar58 = lVar57 * 0x20;
              plVar89 = &local_34a0 + lVar57 * 4;
              local_4350 = (float *)(uVar67 & 0xffffffff);
              local_4368 = uVar67;
              auVar124._0_12_ = ZEXT812(0x3f800000);
              auVar124._12_4_ = 0;
              if (0 < (int)uVar67) {
                local_43a8 = (ulong)(uint)local_3fb0.pos;
                pmVar50 = (ma_uint8 *)0x0;
LAB_00158dd9:
                puVar71 = &local_4338;
                lVar51 = (long)pmVar50 * 0x20;
                plVar1 = plVar89 + (long)pmVar50 * 4;
                uVar6 = local_3498[lVar57 * 0x10 + (long)pmVar50 * 0x10];
                puVar70 = ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                          ::g_scf_partitions +
                          (((ulong)(local_348f[lVar51 + lVar58] == 0) + 1) -
                          (ulong)(local_348f[lVar51 + lVar58 + 1] == 0)) * 0x1c;
                bVar76 = local_3488[lVar51 + lVar58 + 5];
                if ((dec->header[1] & 8) == 0) {
                  bVar55 = (dec->header[3] & 0x10) >> 4 & pmVar50 != (ma_uint8 *)0x0;
                  uVar56 = (uint)(*(ushort *)((long)plVar1 + 0xc) >> bVar55);
                  uVar67 = 0;
                  if (bVar55 != 0) {
                    uVar67 = 0xc;
                  }
                  puVar74 = ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                            ::g_mod + uVar67;
                  do {
                    uVar77 = 1;
                    lVar51 = 3;
                    do {
                      bVar55 = puVar74[lVar51];
                      local_439c[lVar51] = (byte)((uVar56 / uVar77) % (ulong)bVar55);
                      uVar81 = (int)uVar77 * (uint)bVar55;
                      uVar77 = (ulong)uVar81;
                      bVar91 = lVar51 != 0;
                      lVar51 = lVar51 + -1;
                    } while (bVar91);
                    uVar67 = uVar67 + 4;
                    puVar74 = puVar74 + 4;
                    uVar56 = uVar56 - uVar81;
                  } while (-1 < (int)uVar56);
                  puVar70 = puVar70 + (uVar67 & 0xffffffff);
                  uVar56 = 0xfffffff0;
                }
                else {
                  uVar56 = (uint)*(byte *)((long)plVar1 + 0x1f);
                  local_439c[0] =
                       (byte)ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                             ::g_scfc_decode[*(ushort *)((long)plVar1 + 0xc)] >> 2;
                  local_439c[1] = local_439c[0];
                  local_439c[2] =
                       ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                       ::g_scfc_decode[*(ushort *)((long)plVar1 + 0xc)] & 3;
                  local_439c[3] = local_439c[2];
                }
                local_43a8 = (long)(int)local_43a8 + (ulong)uVar6;
                local_4370 = pmVar50;
                puVar74 = local_80 + (long)pmVar50 * 0x27;
                lVar51 = 0;
                do {
                  uVar67 = (ulong)(byte)puVar70[lVar51];
                  if (uVar67 == 0) break;
                  if ((uVar56 & 8) == 0) {
                    bVar55 = local_439c[lVar51];
                    if (bVar55 == 0) {
                      memset(puVar71,0,uVar67);
                      memset(puVar74,0,uVar67);
                    }
                    else {
                      mVar48 = ~(-1 << (bVar55 & 0x1f));
                      if (-1 < (int)uVar56) {
                        mVar48 = 0xffffffff;
                      }
                      uVar77 = 0;
                      do {
                        mVar49 = ma_dr_mp3_bs_get_bits(&local_3fb0,(uint)bVar55);
                        mVar47 = mVar49;
                        if (mVar49 == mVar48) {
                          mVar47 = 0xff;
                        }
                        *(char *)((long)puVar71 + uVar77) = (char)mVar49;
                        puVar74[uVar77] = (char)mVar47;
                        uVar77 = uVar77 + 1;
                      } while (uVar67 != uVar77);
                    }
                  }
                  else {
                    memcpy(puVar71,puVar74,uVar67);
                  }
                  puVar74 = puVar74 + uVar67;
                  puVar71 = (undefined4 *)((long)puVar71 + uVar67);
                  lVar51 = lVar51 + 1;
                  uVar56 = uVar56 * 2;
                  auVar124._0_12_ = ZEXT812(0x3f800000);
                  auVar124._12_4_ = 0;
                } while (lVar51 != 4);
                *(undefined1 *)((long)puVar71 + 2) = 0;
                *(undefined2 *)puVar71 = 0;
                bVar55 = *(byte *)((long)plVar1 + 0x12);
                if ((ulong)bVar55 == 0) {
                  if (*(char *)((long)plVar1 + 0x1c) != '\0') {
                    lVar51 = 0;
                    do {
                      pcVar2 = (char *)((long)&local_4330 + lVar51 + 3);
                      *pcVar2 = *pcVar2 + (&ma_dr_mp3_L3_decode_scalefactors(unsigned_char_const*,unsigned_char*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float*,int)
                                            ::g_preamp)[lVar51];
                      lVar51 = lVar51 + 1;
                    } while (lVar51 != 10);
                  }
                }
                else {
                  cVar3 = *(char *)((long)plVar1 + 0x19);
                  bVar90 = 2 - bVar76;
                  cVar62 = *(char *)((long)plVar1 + 0x1a);
                  uVar77 = (ulong)*(byte *)((long)plVar1 + 0x11);
                  cVar4 = *(char *)((long)plVar1 + 0x1b);
                  uVar67 = 0;
                  do {
                    pcVar2 = (char *)((long)&local_4338 + uVar67 + uVar77);
                    *pcVar2 = *pcVar2 + (cVar3 << (bVar90 & 0x1f));
                    pcVar2 = (char *)((long)&local_4338 + uVar67 + uVar77 + 1);
                    *pcVar2 = *pcVar2 + (cVar62 << (bVar90 & 0x1f));
                    pcVar2 = (char *)((long)&local_4338 + uVar67 + uVar77 + 2);
                    *pcVar2 = *pcVar2 + (cVar4 << (bVar90 & 0x1f));
                    uVar67 = uVar67 + 3;
                  } while (uVar67 < bVar55);
                }
                fVar92 = 2048.0;
                uVar56 = ((uint)((dec->header[3] & 0xe0) == 0x60) * 2 -
                         (uint)*(byte *)((long)plVar1 + 0xe)) + 0x102;
                do {
                  uVar67 = 0x78;
                  if (uVar56 < 0x78) {
                    uVar67 = (ulong)uVar56;
                  }
                  uVar79 = (uint)uVar67;
                  fVar92 = fVar92 * (float)(int)(0x40000000 >> ((byte)(uVar67 >> 2) & 0x1f)) *
                                    (float)(&ma_dr_mp3_L3_ldexp_q2(float,int)::g_expfrac)
                                           [uVar79 & 3];
                  uVar81 = uVar56 - uVar79;
                  bVar91 = (int)uVar79 <= (int)uVar56;
                  uVar56 = uVar81;
                } while (uVar81 != 0 && bVar91);
                uVar56 = (uint)bVar55 + (uint)*(byte *)((long)plVar1 + 0x11);
                if (uVar56 != 0) {
                  uVar67 = 0;
                  do {
                    uVar81 = (uint)*(byte *)((long)&local_4338 + uVar67) << (bVar76 + 1 & 0x1f);
                    fVar95 = fVar92;
                    do {
                      uVar79 = 0x78;
                      if ((int)uVar81 < 0x78) {
                        uVar79 = uVar81;
                      }
                      fVar95 = fVar95 * (float)(int)(0x40000000 >> ((byte)(uVar79 >> 2) & 0x1f)) *
                                        (float)(&ma_dr_mp3_L3_ldexp_q2(float,int)::g_expfrac)
                                               [uVar79 & 3];
                      uVar68 = uVar81 - uVar79;
                      bVar91 = (int)uVar79 <= (int)uVar81;
                      uVar81 = uVar68;
                    } while (uVar68 != 0 && bVar91);
                    local_2220[uVar67] = fVar95;
                    uVar67 = uVar67 + 1;
                  } while (uVar67 != uVar56);
                }
                pfVar60 = local_3420 + (long)local_4370 * 0x240;
                uVar56 = local_3fb0.pos + 7;
                if (-1 < local_3fb0.pos) {
                  uVar56 = local_3fb0.pos;
                }
                local_4378 = local_3fb0.buf;
                puVar80 = (uint *)((long)(local_3fb0.buf + ((int)uVar56 >> 3)) + 4);
                uVar56 = *(uint *)(local_3fb0.buf + ((int)uVar56 >> 3));
                uVar67 = (ulong)((uVar56 >> 0x18 | (uVar56 & 0xff0000) >> 8 | (uVar56 & 0xff00) << 8
                                 | uVar56 << 0x18) << ((byte)local_3fb0.pos & 7));
                uVar81 = (uint)*(ushort *)((long)plVar1 + 10);
                uVar56 = local_3fb0.pos | 0xfffffff8;
                pbVar88 = (byte *)*plVar1;
                if (*(ushort *)((long)plVar1 + 10) == 0) {
                  auVar93._0_12_ = ZEXT812(0);
                  auVar93._12_4_ = 0;
                  uVar81 = 1;
                  pfVar73 = local_2220;
                }
                else {
                  lVar51 = 0;
                  pfVar73 = local_2220;
                  do {
                    bVar76 = *(byte *)((long)plVar1 + lVar51 + 0x13);
                    uVar68 = (uint)*(byte *)((long)plVar1 + lVar51 + 0x16);
                    sVar7 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                       ::tabindex + (ulong)bVar76 * 2);
                    uVar79 = uVar81;
                    if (bVar76 < 0x10) {
                      do {
                        uVar69 = (uint)(*pbVar88 >> 1);
                        uVar81 = uVar69;
                        if (uVar79 < uVar69) {
                          uVar81 = uVar79;
                        }
                        fVar92 = *pfVar73;
                        auVar93 = ZEXT416((uint)fVar92);
                        do {
                          uVar78 = (uint)uVar67;
                          sVar8 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                             ::tabs + (uVar67 >> 0x1b) * 2 + (long)sVar7 * 2);
                          uVar85 = (uint)sVar8;
                          if (sVar8 < 0) {
                            uVar63 = 5;
                            do {
                              uVar78 = (int)uVar67 << (sbyte)uVar63;
                              uVar67 = (ulong)uVar78;
                              uVar56 = uVar56 + uVar63;
                              uVar63 = uVar85 & 7;
                              sVar8 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                                 ::tabs + (ulong)((uVar78 >> (-(char)uVar63 & 0x1fU)
                                                                  ) - ((int)uVar85 >> 3)) * 2 +
                                                          (long)sVar7 * 2);
                              uVar85 = (uint)sVar8;
                            } while (sVar8 < 0);
                          }
                          uVar67 = (ulong)(uVar78 << ((byte)(uVar85 >> 8) & 0x1f));
                          uVar56 = (uVar85 >> 8) + uVar56;
                          bVar91 = true;
                          do {
                            bVar61 = bVar91;
                            uVar78 = uVar85 & 0xf;
                            *pfVar60 = g_ma_dr_mp3_pow43
                                       [((uint)(uVar67 >> 0x1b) & 0x10 | uVar78) ^ 0x10] * fVar92;
                            uVar67 = (ulong)(uint)((int)uVar67 << (uVar78 != 0));
                            uVar56 = uVar56 + (uVar78 != 0);
                            pfVar60 = pfVar60 + 1;
                            uVar85 = uVar85 >> 4;
                            bVar91 = false;
                          } while (bVar61);
                          uVar78 = uVar56;
                          if (-1 < (int)uVar56) {
                            do {
                              uVar56 = *puVar80;
                              puVar80 = (uint *)((long)puVar80 + 1);
                              uVar67 = (ulong)((uint)uVar67 |
                                              (uint)(byte)uVar56 << ((byte)uVar78 & 0x1f));
                              uVar56 = uVar78 - 8;
                              bVar91 = 7 < uVar78;
                              uVar78 = uVar56;
                            } while (bVar91);
                          }
                          uVar81 = uVar81 - 1;
                        } while (uVar81 != 0);
                        pbVar88 = pbVar88 + 1;
                        pfVar73 = pfVar73 + 1;
                        uVar81 = uVar79 - uVar69;
                      } while ((uVar81 != 0 && (int)uVar69 <= (int)uVar79) &&
                              (bVar91 = 0 < (int)uVar68, uVar79 = uVar81, uVar68 = uVar68 - 1,
                              bVar91));
                    }
                    else {
                      bVar76 = ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                               ::g_linbits[bVar76];
                      do {
                        uVar69 = (uint)(*pbVar88 >> 1);
                        uVar81 = uVar69;
                        if (uVar79 < uVar69) {
                          uVar81 = uVar79;
                        }
                        fVar92 = *pfVar73;
                        auVar93 = ZEXT416((uint)fVar92);
                        do {
                          uVar78 = (uint)uVar67;
                          sVar8 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                             ::tabs + (uVar67 >> 0x1b) * 2 + (long)sVar7 * 2);
                          uVar85 = (uint)sVar8;
                          if (sVar8 < 0) {
                            uVar63 = 5;
                            do {
                              uVar78 = (int)uVar67 << (sbyte)uVar63;
                              uVar67 = (ulong)uVar78;
                              uVar56 = uVar56 + uVar63;
                              uVar63 = uVar85 & 7;
                              sVar8 = *(short *)(ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                                                 ::tabs + (ulong)((uVar78 >> (-(char)uVar63 & 0x1fU)
                                                                  ) - ((int)uVar85 >> 3)) * 2 +
                                                          (long)sVar7 * 2);
                              uVar85 = (uint)sVar8;
                            } while (sVar8 < 0);
                          }
                          uVar67 = (ulong)(uVar78 << ((byte)(uVar85 >> 8) & 0x1f));
                          uVar56 = (uVar85 >> 8) + uVar56;
                          bVar91 = true;
                          do {
                            bVar61 = bVar91;
                            uVar78 = uVar85 & 0xf;
                            uVar63 = (uint)uVar67;
                            if (uVar78 == 0xf) {
                              uVar65 = uVar63 >> (0x20 - bVar76 & 0x1f);
                              uVar63 = uVar63 << (bVar76 & 0x1f);
                              uVar56 = uVar56 + bVar76;
                              uVar78 = uVar56;
                              if (-1 < (int)uVar56) {
                                do {
                                  uVar56 = *puVar80;
                                  puVar80 = (uint *)((long)puVar80 + 1);
                                  uVar63 = uVar63 | (uint)(byte)uVar56 << ((byte)uVar78 & 0x1f);
                                  uVar56 = uVar78 - 8;
                                  bVar91 = 7 < uVar78;
                                  uVar78 = uVar56;
                                } while (bVar91);
                              }
                              uVar78 = uVar65 + 0xf;
                              if ((int)uVar78 < 0x81) {
                                fVar95 = g_ma_dr_mp3_pow43[(int)(uVar65 + 0x1f)];
                              }
                              else {
                                uVar65 = uVar78 * 8;
                                if (uVar78 >= 0x400) {
                                  uVar65 = uVar78;
                                }
                                uVar66 = uVar65 * 2 & 0x40;
                                fVar95 = (float)(int)((uVar65 & 0x3f) - uVar66) /
                                         (float)(int)((uVar65 & 0x7fffffc0) + uVar66);
                                fVar95 = ((fVar95 * 0.22222222 + 1.3333334) * fVar95 +
                                         auVar124._0_4_) *
                                         g_ma_dr_mp3_pow43[(ulong)(uVar66 + uVar65 >> 6) + 0x10] *
                                         *(float *)(&DAT_0017a5b8 + (ulong)(uVar78 < 0x400) * 4);
                              }
                              fVar95 = (float)(int)((int)uVar63 >> 0x1f | 1) * fVar95 * fVar92;
                            }
                            else {
                              fVar95 = g_ma_dr_mp3_pow43
                                       [((uint)(uVar67 >> 0x1b) & 0x10 | uVar78) ^ 0x10] * fVar92;
                            }
                            uVar67 = (ulong)(uVar63 << (uVar78 != 0));
                            *pfVar60 = fVar95;
                            uVar56 = uVar56 + (uVar78 != 0);
                            pfVar60 = pfVar60 + 1;
                            uVar85 = uVar85 >> 4;
                            bVar91 = false;
                          } while (bVar61);
                          uVar78 = uVar56;
                          if (-1 < (int)uVar56) {
                            do {
                              uVar56 = *puVar80;
                              puVar80 = (uint *)((long)puVar80 + 1);
                              uVar67 = (ulong)((uint)uVar67 |
                                              (uint)(byte)uVar56 << ((byte)uVar78 & 0x1f));
                              uVar56 = uVar78 - 8;
                              bVar91 = 7 < uVar78;
                              uVar78 = uVar56;
                            } while (bVar91);
                          }
                          uVar81 = uVar81 - 1;
                        } while (uVar81 != 0);
                        pbVar88 = pbVar88 + 1;
                        pfVar73 = pfVar73 + 1;
                        uVar81 = uVar79 - uVar69;
                      } while ((uVar81 != 0 && (int)uVar69 <= (int)uVar79) &&
                              (bVar91 = 0 < (int)uVar68, uVar79 = uVar81, uVar68 = uVar68 - 1,
                              bVar91));
                    }
                    lVar51 = lVar51 + 1;
                  } while (0 < (int)uVar81);
                  uVar81 = 1 - uVar81;
                }
                puVar70 = ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                          ::tab33;
                if (*(char *)((long)plVar1 + 0x1e) == '\0') {
                  puVar70 = ma_dr_mp3_L3_huffman(float*,ma_dr_mp3_bs*,ma_dr_mp3_L3_gr_info_const*,float_const*,int)
                            ::tab32;
                }
                do {
                  bVar76 = puVar70[uVar67 >> 0x1c];
                  if ((bVar76 & 8) == 0) {
                    bVar76 = puVar70[(ulong)((uint)((int)uVar67 << 4) >> (-(bVar76 & 3) & 0x1f)) +
                                     (ulong)(bVar76 >> 3)];
                  }
                  uVar68 = bVar76 & 7;
                  uVar79 = (int)uVar67 << (sbyte)uVar68;
                  uVar56 = uVar68 + uVar56;
                  if ((long)local_43a8 <
                      (long)(int)uVar56 + ((long)puVar80 - (long)local_3fb0.buf) * 8 + -0x18)
                  goto LAB_001596d0;
                  uVar81 = uVar81 - 1;
                  if (uVar81 == 0) {
                    bVar55 = *pbVar88;
                    if (bVar55 < 2) goto LAB_001596d0;
                    pbVar88 = pbVar88 + 1;
                    uVar81 = (uint)(bVar55 >> 1);
                    auVar93 = ZEXT416((uint)*pfVar73);
                    pfVar73 = pfVar73 + 1;
                  }
                  if (0x7f < bVar76) {
                    auVar97 = auVar93;
                    if ((int)uVar79 < 0) {
                      auVar97._0_4_ = auVar93._0_4_ ^ 0x80000000;
                      auVar97._4_4_ = 0;
                      auVar97._8_4_ = auVar93._8_4_ ^ 0x80000000;
                      auVar97._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    }
                    *pfVar60 = auVar97._0_4_;
                    uVar79 = uVar79 * 2;
                    uVar56 = uVar56 + 1;
                  }
                  if ((bVar76 & 0x40) != 0) {
                    auVar98 = auVar93;
                    if ((int)uVar79 < 0) {
                      auVar98._0_4_ = auVar93._0_4_ ^ 0x80000000;
                      auVar98._4_4_ = 0;
                      auVar98._8_4_ = auVar93._8_4_ ^ 0x80000000;
                      auVar98._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    }
                    pfVar60[1] = auVar98._0_4_;
                    uVar79 = uVar79 * 2;
                    uVar56 = uVar56 + 1;
                  }
                  uVar81 = uVar81 - 1;
                  if (uVar81 == 0) {
                    bVar55 = *pbVar88;
                    if (bVar55 < 2) goto LAB_001596d0;
                    pbVar88 = pbVar88 + 1;
                    uVar81 = (uint)(bVar55 >> 1);
                    auVar93 = ZEXT416((uint)*pfVar73);
                    pfVar73 = pfVar73 + 1;
                  }
                  if ((bVar76 & 0x20) != 0) {
                    auVar99 = auVar93;
                    if ((int)uVar79 < 0) {
                      auVar99._0_4_ = auVar93._0_4_ ^ 0x80000000;
                      auVar99._4_4_ = 0;
                      auVar99._8_4_ = auVar93._8_4_ ^ 0x80000000;
                      auVar99._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    }
                    pfVar60[2] = auVar99._0_4_;
                    uVar79 = uVar79 * 2;
                    uVar56 = uVar56 + 1;
                  }
                  if ((bVar76 & 0x10) != 0) {
                    auVar100 = auVar93;
                    if ((int)uVar79 < 0) {
                      auVar100._0_4_ = auVar93._0_4_ ^ 0x80000000;
                      auVar100._4_4_ = 0;
                      auVar100._8_4_ = auVar93._8_4_ ^ 0x80000000;
                      auVar100._12_4_ = auVar93._12_4_ ^ 0x80000000;
                    }
                    pfVar60[3] = auVar100._0_4_;
                    uVar79 = uVar79 * 2;
                    uVar56 = uVar56 + 1;
                  }
                  uVar67 = (ulong)uVar79;
                  puVar52 = puVar80;
                  if (-1 < (int)uVar56) {
                    puVar52 = (uint *)((long)puVar80 + (ulong)(uVar56 >> 3) + 1);
                    uVar79 = uVar56;
                    do {
                      uVar68 = *puVar80;
                      puVar80 = (uint *)((long)puVar80 + 1);
                      uVar67 = (ulong)((uint)uVar67 | (uint)(byte)uVar68 << ((byte)uVar79 & 0x1f));
                      bVar91 = 7 < uVar79;
                      uVar79 = uVar79 - 8;
                    } while (bVar91);
                    uVar56 = (uVar56 & 0x80000007) - 8;
                  }
                  pfVar60 = pfVar60 + 4;
                  puVar80 = puVar52;
                } while( true );
              }
LAB_001596f5:
              bVar76 = dec->header[3];
              if ((bVar76 & 0x10) == 0) {
                if ((bVar76 & 0xe0) == 0x60) {
                  uVar67 = 0xfffffffffffffffc;
                  do {
                    fVar92 = afStack_3410[uVar67];
                    fVar95 = afStack_3410[uVar67 + 1];
                    fVar96 = afStack_3410[uVar67 + 2];
                    fVar31 = afStack_3410[uVar67 + 3];
                    auVar94 = *(undefined1 (*) [16])(afStack_2b10 + uVar67);
                    auVar113._0_4_ = fVar92 + auVar94._0_4_;
                    auVar113._4_4_ = fVar95 + auVar94._4_4_;
                    auVar113._8_4_ = fVar96 + auVar94._8_4_;
                    auVar113._12_4_ = fVar31 + auVar94._12_4_;
                    *(undefined1 (*) [16])(afStack_3410 + uVar67) = auVar113;
                    afStack_2b10[uVar67] = fVar92 - auVar94._0_4_;
                    afStack_2b10[uVar67 + 1] = fVar95 - auVar94._4_4_;
                    afStack_2b10[uVar67 + 2] = fVar96 - auVar94._8_4_;
                    local_2220[uVar67 - 0x239] = fVar31 - auVar94._12_4_;
                    uVar67 = uVar67 + 4;
                  } while (uVar67 < 0x239);
                }
              }
              else {
                bVar55 = local_348f[lVar58];
                bVar90 = local_348f[lVar58 + 1];
                lVar58 = *plVar89;
                local_4330 = -NAN;
                _local_4338 = 0xffffffffffffffff;
                uVar56 = (uint)bVar90 + (uint)bVar55;
                if (uVar56 != 0) {
                  uVar67 = 0;
                  puVar70 = local_2b20;
                  do {
                    uVar77 = (ulong)*(byte *)(lVar58 + uVar67);
                    if (uVar77 == 0) {
                      uVar77 = 0;
                    }
                    else {
                      uVar86 = 0;
                      do {
                        if (((*(float *)(puVar70 + uVar86 * 4) != 0.0) ||
                            (*(float *)(puVar70 + uVar86 * 4 + 4) != 0.0)) ||
                           (NAN(*(float *)(puVar70 + uVar86 * 4 + 4)))) {
                          (&local_4338)[(uint)((int)uVar67 + (int)((uVar67 & 0xffffffff) / 3) * -3)]
                               = (int)uVar67;
                          break;
                        }
                        uVar86 = uVar86 + 2;
                      } while (uVar86 < uVar77);
                    }
                    puVar70 = puVar70 + uVar77 * 4;
                    uVar67 = uVar67 + 1;
                  } while (uVar67 != uVar56);
                }
                if (bVar55 != 0) {
                  if ((int)fStack_4334 < (int)local_4338) {
                    fStack_4334 = local_4338;
                  }
                  if ((int)fStack_4334 <= (int)local_4330) {
                    fStack_4334 = local_4330;
                  }
                  local_4330 = fStack_4334;
                  _local_4338 = CONCAT44(fStack_4334,fStack_4334);
                }
                uVar81 = (uint)(bVar90 != 0) * 2 + 1;
                lVar58 = (long)(int)(uVar56 - uVar81) + -0x59;
                uVar67 = 0;
                do {
                  if ((int)(&local_4338)[uVar67] < (int)(uVar56 + uVar81 * -2 + (int)uVar67)) {
                    bVar55 = local_59[uVar67 + (lVar58 - (ulong)uVar81) + 0x59];
                  }
                  else {
                    bVar55 = (char)(dec->header[1] << 4) >> 7 & 3;
                  }
                  local_59[uVar67 + lVar58 + 0x59] = bVar55;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar81);
                pbVar88 = (byte *)*plVar89;
                bVar55 = dec->header[1];
                bVar90 = 7;
                if ((bVar55 & 8) == 0) {
                  bVar90 = 0x40;
                }
                bVar54 = *pbVar88;
                if (bVar54 != 0) {
                  uVar9 = auStack_3474[lVar57 * 0x10];
                  fVar92 = *(float *)(&DAT_0017a5c0 + (ulong)((bVar76 & 0x20) == 0) * 4);
                  uVar67 = 0;
                  pfVar60 = local_3420;
                  do {
                    iVar84 = (int)uVar67;
                    if ((int)(&local_4338)[(uint)(iVar84 + (int)(uVar67 / 3) * -3)] < iVar84) {
                      bVar5 = local_59[uVar67];
                      if (bVar90 <= bVar5) goto LAB_001599ad;
                      if ((bVar55 & 8) == 0) {
                        auVar101 = auVar124;
                        uVar56 = (bVar5 + 1 >> 1) << ((byte)uVar9 & 1);
                        do {
                          auVar94 = auVar101;
                          uVar81 = 0x78;
                          if ((int)uVar56 < 0x78) {
                            uVar81 = uVar56;
                          }
                          auVar101._4_12_ = auVar94._4_12_;
                          auVar101._0_4_ =
                               auVar94._0_4_ *
                               (float)(int)(0x40000000 >> ((byte)(uVar81 >> 2) & 0x1f)) *
                               (float)(&ma_dr_mp3_L3_ldexp_q2(float,int)::g_expfrac)[uVar81 & 3];
                          uVar79 = uVar56 - uVar81;
                          bVar91 = (int)uVar81 <= (int)uVar56;
                          uVar56 = uVar79;
                        } while (uVar79 != 0 && bVar91);
                        auVar114 = auVar124;
                        if ((bVar5 & 1) != 0) {
                          auVar114._4_4_ = 0;
                          auVar114._0_4_ = auVar101._0_4_;
                          auVar114._8_4_ = auVar94._8_4_;
                          auVar114._12_4_ = auVar94._12_4_;
                          auVar101 = auVar124;
                        }
                        fVar96 = auVar101._0_4_;
                        fVar95 = auVar114._0_4_;
                      }
                      else {
                        fVar95 = *(float *)(ma_dr_mp3_L3_stereo_process(float*,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int*,int)
                                            ::g_pan + (ulong)bVar5 * 8);
                        fVar96 = *(float *)(ma_dr_mp3_L3_stereo_process(float*,unsigned_char_const*,unsigned_char_const*,unsigned_char_const*,int*,int)
                                            ::g_pan + (ulong)bVar5 * 8 + 4);
                      }
                      uVar77 = 0;
                      do {
                        pfVar60[uVar77 + 0x240] = fVar96 * fVar92 * pfVar60[uVar77];
                        pfVar60[uVar77] = pfVar60[uVar77] * fVar95 * fVar92;
                        uVar77 = uVar77 + 1;
                      } while (bVar54 != uVar77);
                    }
                    else {
LAB_001599ad:
                      if ((bVar76 & 0x20) != 0) {
                        uVar77 = 0;
                        if (3 < bVar54) {
                          uVar77 = 0;
                          do {
                            pfVar73 = pfVar60 + uVar77;
                            fVar95 = *pfVar73;
                            fVar96 = pfVar73[1];
                            fVar31 = pfVar73[2];
                            fVar32 = pfVar73[3];
                            auVar94 = *(undefined1 (*) [16])(pfVar60 + uVar77 + 0x240);
                            pfVar73 = pfVar60 + uVar77;
                            *pfVar73 = fVar95 + auVar94._0_4_;
                            pfVar73[1] = fVar96 + auVar94._4_4_;
                            pfVar73[2] = fVar31 + auVar94._8_4_;
                            pfVar73[3] = fVar32 + auVar94._12_4_;
                            auVar102._0_4_ = fVar95 - auVar94._0_4_;
                            auVar102._4_4_ = fVar96 - auVar94._4_4_;
                            auVar102._8_4_ = fVar31 - auVar94._8_4_;
                            auVar102._12_4_ = fVar32 - auVar94._12_4_;
                            *(undefined1 (*) [16])(pfVar60 + uVar77 + 0x240) = auVar102;
                            uVar77 = uVar77 + 4;
                          } while (uVar77 < bVar54 - 3);
                        }
                        if ((int)uVar77 < (int)(uint)bVar54) {
                          uVar77 = uVar77 & 0xffffffff;
                          do {
                            fVar95 = pfVar60[uVar77];
                            pfVar60[uVar77] = fVar95 + pfVar60[uVar77 + 0x240];
                            pfVar60[uVar77 + 0x240] = fVar95 - pfVar60[uVar77 + 0x240];
                            uVar77 = uVar77 + 1;
                          } while (bVar54 != uVar77);
                        }
                      }
                    }
                    pfVar60 = pfVar60 + pbVar88[uVar67];
                    uVar67 = (ulong)(iVar84 + 1);
                    bVar54 = pbVar88[uVar67];
                  } while (bVar54 != 0);
                }
              }
              if (0 < (int)local_4368) {
                puVar71 = (undefined4 *)0x0;
                do {
                  cVar3 = (char)plVar89[2];
                  iVar84 = (uint)(cVar3 != '\0') * 2 <<
                           ((byte)(((dec->header[1] >> 3 & 1) + ((dec->header[1] >> 4 & 1) != 0)) *
                                   '\x03' + (dec->header[2] >> 2 & 3)) == '\x02');
                  if (*(char *)((long)plVar89 + 0x12) == '\0') {
                    pfVar60 = local_3420 + (long)puVar71 * 0x240;
                    iVar83 = 0x1f;
                    pfVar73 = pfVar60;
LAB_00159c01:
                    do {
                      lVar57 = 0;
                      bVar91 = true;
                      do {
                        bVar61 = bVar91;
                        pfVar64 = pfVar60 + lVar57 + 0x12;
                        fVar92 = *pfVar64;
                        fVar95 = pfVar64[1];
                        fVar96 = pfVar64[2];
                        fVar31 = pfVar64[3];
                        fVar32 = pfVar60[0xe - lVar57];
                        fVar33 = pfVar60[0xf - lVar57];
                        fVar34 = pfVar60[0x10 - lVar57];
                        fVar35 = pfVar60[0x11 - lVar57];
                        auVar94 = *(undefined1 (*) [16])
                                   (ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar57 * 4);
                        lVar58 = lVar57 * 4;
                        fVar36 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar58 + 0x20
                                           );
                        fVar37 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar58 + 0x24
                                           );
                        fVar38 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar58 + 0x28
                                           );
                        fVar39 = *(float *)(ma_dr_mp3_L3_antialias(float*,int)::g_aa + lVar58 + 0x2c
                                           );
                        pfVar64 = pfVar60 + lVar57 + 0x12;
                        *pfVar64 = fVar92 * auVar94._0_4_ - fVar35 * fVar36;
                        pfVar64[1] = fVar95 * auVar94._4_4_ - fVar34 * fVar37;
                        pfVar64[2] = fVar96 * auVar94._8_4_ - fVar33 * fVar38;
                        pfVar64[3] = fVar31 * auVar94._12_4_ - fVar32 * fVar39;
                        auVar103._4_4_ = fVar33 * auVar94._8_4_ + fVar96 * fVar38;
                        auVar103._0_4_ = fVar32 * auVar94._12_4_ + fVar31 * fVar39;
                        auVar103._8_4_ = fVar34 * auVar94._4_4_ + fVar95 * fVar37;
                        auVar103._12_4_ = fVar35 * auVar94._0_4_ + fVar92 * fVar36;
                        *(undefined1 (*) [16])(pfVar60 + (0xe - lVar57)) = auVar103;
                        lVar57 = 4;
                        bVar91 = false;
                      } while (bVar61);
                      bVar91 = 1 < iVar83;
                      pfVar60 = pfVar60 + 0x12;
                      iVar83 = iVar83 + -1;
                    } while (bVar91);
                    overlap = dec->mdct_overlap + (long)puVar71;
                    cVar62 = *(char *)((long)plVar89 + 0xf);
                    pfVar60 = pfVar73;
                    if (cVar3 == '\0') goto LAB_00159d3a;
                    ma_dr_mp3_L3_imdct36
                              (pfVar73,*overlap,
                               (float *)ma_dr_mp3_L3_imdct_gr(float*,float*,unsigned_int,unsigned_int)
                                        ::g_mdct_window,iVar84);
                    pfVar73 = (float *)((long)local_3420 +
                                       (ulong)(uint)(iVar84 * 0x48) + (long)puVar71 * 0x900);
                    overlap = (float (*) [288])((long)*overlap + (ulong)(uint)(iVar84 * 0x24));
                    if (cVar62 == '\x02') goto LAB_00159d42;
LAB_00159cef:
                    ma_dr_mp3_L3_imdct36
                              (pfVar73,*overlap,
                               (float *)(ma_dr_mp3_L3_imdct_gr(float*,float*,unsigned_int,unsigned_int)
                                         ::g_mdct_window + (ulong)(cVar62 == '\x03') * 0x48),
                               0x20 - iVar84);
                  }
                  else {
                    pfVar60 = local_3420 + (long)puVar71 * 0x240;
                    pfVar73 = (float *)((ulong)(uint)(iVar84 * 0x48) + (long)pfVar60);
                    bVar76 = *(byte *)(*plVar89 + (ulong)*(byte *)((long)plVar89 + 0x11));
                    if (bVar76 == 0) {
                      pfVar64 = local_2180;
                    }
                    else {
                      lVar57 = *plVar89 + (ulong)*(byte *)((long)plVar89 + 0x11);
                      pfVar59 = local_2180;
                      pfVar72 = pfVar73;
                      do {
                        pfVar75 = pfVar72 + (ulong)bVar76 * 2;
                        lVar58 = 0;
                        pfVar64 = pfVar59;
                        do {
                          *pfVar59 = pfVar72[lVar58];
                          pfVar59[1] = pfVar72[(ulong)bVar76 + lVar58];
                          pfVar59[2] = *pfVar75;
                          pfVar59 = pfVar59 + 3;
                          pfVar64 = pfVar64 + 3;
                          pfVar75 = pfVar75 + 1;
                          lVar58 = lVar58 + 1;
                        } while ((uint)bVar76 != (uint)lVar58);
                        bVar76 = *(byte *)(lVar57 + 3);
                        lVar57 = lVar57 + 3;
                        pfVar72 = pfVar75;
                      } while (bVar76 != 0);
                    }
                    memcpy(pfVar73,local_2180,(long)pfVar64 - (long)local_2180);
                    if (cVar3 != '\0') {
                      iVar83 = iVar84 + -1;
                      pfVar73 = pfVar60;
                      goto LAB_00159c01;
                    }
                    overlap = dec->mdct_overlap + (long)puVar71;
                    cVar62 = *(char *)((long)plVar89 + 0xf);
LAB_00159d3a:
                    pfVar73 = pfVar60;
                    if (cVar62 != '\x02') goto LAB_00159cef;
LAB_00159d42:
                    uVar56 = 0x21 - iVar84;
                    lVar57 = 0;
                    do {
                      pfVar64 = (float *)((long)pfVar73 + lVar57 * 2);
                      pfVar59 = pfVar64;
                      pfVar72 = (float *)&local_4338;
                      for (lVar58 = 0x12; lVar58 != 0; lVar58 = lVar58 + -1) {
                        *pfVar72 = *pfVar59;
                        pfVar59 = pfVar59 + (ulong)bVar42 * -2 + 1;
                        pfVar72 = pfVar72 + (ulong)bVar42 * -2 + 1;
                      }
                      pfVar59 = (float *)((long)*overlap + lVar57 + 0x18);
                      *(undefined8 *)(pfVar64 + 4) = *(undefined8 *)(pfVar59 + -2);
                      uVar53 = *(undefined8 *)(pfVar59 + -4);
                      *(undefined8 *)pfVar64 = *(undefined8 *)(pfVar59 + -6);
                      *(undefined8 *)(pfVar64 + 2) = uVar53;
                      ma_dr_mp3_L3_imdct12
                                ((float *)&local_4338,(float *)((long)pfVar73 + lVar57 * 2 + 0x18),
                                 pfVar59);
                      ma_dr_mp3_L3_imdct12
                                (&fStack_4334,(float *)((long)pfVar73 + lVar57 * 2 + 0x30),pfVar59);
                      ma_dr_mp3_L3_imdct12
                                ((float *)&local_4330,(float *)((long)*overlap + lVar57),pfVar59);
                      uVar56 = uVar56 - 1;
                      lVar57 = lVar57 + 0x24;
                    } while (1 < uVar56);
                  }
                  pfVar60 = pfVar60 + 0x13;
                  uVar56 = 0;
                  do {
                    uVar67 = 0xffffffffffffffff;
                    do {
                      pfVar60[uVar67 + 1] = (float)((uint)pfVar60[uVar67 + 1] ^ (uint)DAT_00178d70);
                      uVar67 = uVar67 + 2;
                    } while (uVar67 < 0x10);
                    pfVar60 = pfVar60 + 0x24;
                    bVar91 = uVar56 < 0x1e;
                    uVar56 = uVar56 + 2;
                  } while (bVar91);
                  puVar71 = (undefined4 *)((long)puVar71 + 1);
                  plVar89 = plVar89 + 4;
                } while ((float *)puVar71 != local_4350);
              }
              pmVar41 = local_4358;
              pmVar40 = local_4360;
              ma_dr_mp3d_synth_granule
                        (local_4340,local_3420,0x12,local_4358->channels,local_4360,local_2180);
              uVar67 = (ulong)pmVar41->channels;
              local_4360 = pmVar40 + uVar67 * 0x240;
              iVar84 = 1;
              uVar53 = 0;
            } while (((byte)local_4344 & (local_4380[1] & 8) >> 3) != 0);
            uVar56 = local_3fb0.pos + 7U >> 3;
          }
          uVar79 = ((uint)local_3fb0.limit >> 3) - uVar56;
          uVar81 = 0x1ff;
          if ((int)uVar79 < 0x1ff) {
            uVar81 = uVar79;
          }
          if (0 < (int)uVar79) {
            if (0x1ff < uVar79) {
              uVar56 = ((uint)local_3fb0.limit >> 3) - 0x1ff;
            }
            memcpy(dec->reserv_buf,local_3fa0 + uVar56,(ulong)uVar81);
          }
          uVar56 = (uint)(iVar44 <= iVar43);
          dec->reserv = uVar81;
        }
        else {
          if (local_4360 == (ma_dr_mp3d_sample_t *)0x0) {
            if ((~bVar76 & 6) != 0) {
              return 0x480 >> ((bVar76 & 0xe) == 2);
            }
            return 0x180;
          }
          bVar42 = pmVar50[3] >> 6;
          if (bVar42 == 3) {
            uVar56 = 0;
          }
          else if (bVar42 == 1) {
            uVar56 = (pmVar50[3] >> 2 & 0xc) + 4;
          }
          else {
            uVar56 = 0x20;
          }
          if ((~bVar76 & 6) == 0) {
            puVar70 = &ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)
                       ::g_alloc_L1;
            uVar79 = 0x20;
          }
          else if ((bVar76 & 8) == 0) {
            puVar70 = &ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)
                       ::g_alloc_L2M2;
            uVar79 = 0x1e;
          }
          else {
            bVar90 = pmVar50[2] >> 2 & 3;
            bVar55 = *(byte *)((ulong)(pmVar50[2] >> 4) +
                              (long)(int)((bVar76 >> 1 & 3) - 1) * 0xf + 0x17ca3d);
            uVar81 = 0xc0;
            if (bVar55 != 0) {
              uVar81 = (uint)bVar55 + (uint)bVar55 >> (bVar42 != 3);
            }
            if (uVar81 < 0x38) {
              uVar79 = (uint)(bVar90 == 2) * 4 + 8;
              puVar70 = (undefined1 *)
                        &ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)
                         ::g_alloc_L2M1_lowrate;
            }
            else {
              uVar79 = 0x1b;
              if (bVar90 != 1) {
                uVar79 = (uint)(0x5f < uVar81) * 3 + 0x1b;
              }
              puVar70 = ma_dr_mp3_L12_subband_alloc_table(unsigned_char_const*,ma_dr_mp3_L12_scale_info*)
                        ::g_alloc_L2M1;
            }
          }
          local_4038 = (byte)uVar79;
          uVar81 = uVar79;
          if (uVar56 < uVar79) {
            uVar81 = uVar56;
          }
          uVar67 = (ulong)uVar81;
          local_4037 = (byte)uVar81;
          uVar77 = 0;
          puVar74 = ma_dr_mp3_L12_read_scale_info(unsigned_char_const*,ma_dr_mp3_bs*,ma_dr_mp3_L12_scale_info*)
                    ::g_bitalloc_code_tab;
          uVar81 = 0;
          uVar68 = 0;
          do {
            if (uVar77 == uVar68) {
              uVar68 = uVar68 + (byte)puVar70[2];
              uVar81 = (uint)(byte)puVar70[1];
              puVar74 = ma_dr_mp3_L12_read_scale_info(unsigned_char_const*,ma_dr_mp3_bs*,ma_dr_mp3_L12_scale_info*)
                        ::g_bitalloc_code_tab + (byte)*puVar70;
              puVar70 = puVar70 + 3;
            }
            mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,uVar81);
            bVar42 = puVar74[mVar48];
            local_4036[uVar77 * 2] = bVar42;
            if (uVar77 < uVar67) {
              mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,uVar81);
              bVar42 = puVar74[mVar48];
            }
            if (uVar56 == 0) {
              bVar42 = 0;
            }
            local_4036[uVar77 * 2 + 1] = bVar42;
            uVar77 = uVar77 + 1;
          } while (uVar79 != uVar77);
          uVar77 = 0;
          pbVar88 = local_4036;
          do {
            bVar42 = (local_4036[uVar77] == 0) << 2 | 2;
            if ((local_4036[uVar77] != 0) && ((bVar76 & 6) != 6)) {
              mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,2);
              bVar42 = (byte)mVar48;
            }
            abStack_3ff6[uVar77] = bVar42;
            uVar77 = uVar77 + 1;
          } while (uVar79 * 2 != uVar77);
          pfVar60 = (float *)&local_4338;
          local_43f8 = 0;
          do {
            bVar42 = *pbVar88;
            uVar81 = 0;
            if (bVar42 != 0) {
              uVar81 = 0x13U >> (abStack_3ff6[local_43f8] & 0x1f) | 4;
            }
            pbVar88 = pbVar88 + 1;
            fVar92 = 0.0;
            uVar68 = 4;
            do {
              if ((uVar68 & uVar81) != 0) {
                mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,6);
                fVar92 = (float)(int)(0x200000 >> ((byte)((int)mVar48 / 3) & 0x1f)) *
                         *(float *)(ma_dr_mp3_L12_read_scalefactors(ma_dr_mp3_bs*,unsigned_char*,unsigned_char*,int,float*)
                                    ::g_deq_L12 +
                                   (long)(int)((int)mVar48 % 3 +
                                              (uint)bVar42 + (uint)bVar42 * 2 + -6) * 4);
              }
              *pfVar60 = fVar92;
              pfVar60 = pfVar60 + 1;
              bVar91 = 1 < uVar68;
              uVar68 = uVar68 >> 1;
            } while (bVar91);
            local_43f8 = local_43f8 + 1;
          } while (local_43f8 != uVar79 * 2);
          if (uVar56 < uVar79) {
            lVar58 = uVar79 - uVar67;
            lVar57 = lVar58 + -1;
            auVar94._8_4_ = (int)lVar57;
            auVar94._0_8_ = lVar57;
            auVar94._12_4_ = (int)((ulong)lVar57 >> 0x20);
            lVar57 = uVar67 * 2;
            uVar67 = 0;
            do {
              auVar125._8_4_ = (int)uVar67;
              auVar125._0_8_ = uVar67;
              auVar125._12_4_ = (int)(uVar67 >> 0x20);
              auVar127 = auVar94 ^ _DAT_00178d70;
              auVar129 = (auVar125 | _DAT_00178d60) ^ _DAT_00178d70;
              iVar43 = auVar127._0_4_;
              iVar87 = -(uint)(iVar43 < auVar129._0_4_);
              iVar84 = auVar127._4_4_;
              auVar131._4_4_ = -(uint)(iVar84 < auVar129._4_4_);
              iVar44 = auVar127._8_4_;
              iVar46 = -(uint)(iVar44 < auVar129._8_4_);
              iVar83 = auVar127._12_4_;
              auVar131._12_4_ = -(uint)(iVar83 < auVar129._12_4_);
              auVar104._4_4_ = iVar87;
              auVar104._0_4_ = iVar87;
              auVar104._8_4_ = iVar46;
              auVar104._12_4_ = iVar46;
              auVar104 = pshuflw(in_XMM1,auVar104,0xe8);
              auVar130._4_4_ = -(uint)(auVar129._4_4_ == iVar84);
              auVar130._12_4_ = -(uint)(auVar129._12_4_ == iVar83);
              auVar130._0_4_ = auVar130._4_4_;
              auVar130._8_4_ = auVar130._12_4_;
              auVar115 = pshuflw(in_XMM2,auVar130,0xe8);
              auVar131._0_4_ = auVar131._4_4_;
              auVar131._8_4_ = auVar131._12_4_;
              auVar129 = pshuflw(auVar104,auVar131,0xe8);
              auVar127._8_4_ = 0xffffffff;
              auVar127._0_8_ = 0xffffffffffffffff;
              auVar127._12_4_ = 0xffffffff;
              auVar127 = (auVar129 | auVar115 & auVar104) ^ auVar127;
              auVar127 = packssdw(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                local_4036[uVar67 * 2 + lVar57 + 1] = 0;
              }
              auVar115._4_4_ = iVar87;
              auVar115._0_4_ = iVar87;
              auVar115._8_4_ = iVar46;
              auVar115._12_4_ = iVar46;
              auVar131 = auVar130 & auVar115 | auVar131;
              auVar127 = packssdw(auVar131,auVar131);
              auVar129._8_4_ = 0xffffffff;
              auVar129._0_8_ = 0xffffffffffffffff;
              auVar129._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 ^ auVar129,auVar127 ^ auVar129);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._0_4_ >> 8 & 1) != 0) {
                local_4036[uVar67 * 2 + lVar57 + 3] = 0;
              }
              auVar127 = (auVar125 | _DAT_00178d90) ^ _DAT_00178d70;
              auVar116._0_4_ = -(uint)(iVar43 < auVar127._0_4_);
              auVar116._4_4_ = -(uint)(iVar84 < auVar127._4_4_);
              auVar116._8_4_ = -(uint)(iVar44 < auVar127._8_4_);
              auVar116._12_4_ = -(uint)(iVar83 < auVar127._12_4_);
              auVar132._4_4_ = auVar116._0_4_;
              auVar132._0_4_ = auVar116._0_4_;
              auVar132._8_4_ = auVar116._8_4_;
              auVar132._12_4_ = auVar116._8_4_;
              iVar87 = -(uint)(auVar127._4_4_ == iVar84);
              iVar46 = -(uint)(auVar127._12_4_ == iVar83);
              auVar19._4_4_ = iVar87;
              auVar19._0_4_ = iVar87;
              auVar19._8_4_ = iVar46;
              auVar19._12_4_ = iVar46;
              auVar142._4_4_ = auVar116._4_4_;
              auVar142._0_4_ = auVar116._4_4_;
              auVar142._8_4_ = auVar116._12_4_;
              auVar142._12_4_ = auVar116._12_4_;
              auVar127 = auVar19 & auVar132 | auVar142;
              auVar127 = packssdw(auVar127,auVar127);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 ^ auVar10,auVar127 ^ auVar10);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._0_4_ >> 0x10 & 1) != 0) {
                local_4036[uVar67 * 2 + lVar57 + 5] = 0;
              }
              auVar127 = pshufhw(auVar127,auVar132,0x84);
              auVar20._4_4_ = iVar87;
              auVar20._0_4_ = iVar87;
              auVar20._8_4_ = iVar46;
              auVar20._12_4_ = iVar46;
              auVar129 = pshufhw(auVar116,auVar20,0x84);
              auVar104 = pshufhw(auVar127,auVar142,0x84);
              auVar105._8_4_ = 0xffffffff;
              auVar105._0_8_ = 0xffffffffffffffff;
              auVar105._12_4_ = 0xffffffff;
              auVar105 = (auVar104 | auVar129 & auVar127) ^ auVar105;
              auVar127 = packssdw(auVar105,auVar105);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._0_4_ >> 0x18 & 1) != 0) {
                local_4036[uVar67 * 2 + lVar57 + 7] = 0;
              }
              auVar127 = (auVar125 | _DAT_0017f180) ^ _DAT_00178d70;
              auVar117._0_4_ = -(uint)(iVar43 < auVar127._0_4_);
              auVar117._4_4_ = -(uint)(iVar84 < auVar127._4_4_);
              auVar117._8_4_ = -(uint)(iVar44 < auVar127._8_4_);
              auVar117._12_4_ = -(uint)(iVar83 < auVar127._12_4_);
              auVar21._4_4_ = auVar117._0_4_;
              auVar21._0_4_ = auVar117._0_4_;
              auVar21._8_4_ = auVar117._8_4_;
              auVar21._12_4_ = auVar117._8_4_;
              auVar129 = pshuflw(auVar142,auVar21,0xe8);
              auVar106._0_4_ = -(uint)(auVar127._0_4_ == iVar43);
              auVar106._4_4_ = -(uint)(auVar127._4_4_ == iVar84);
              auVar106._8_4_ = -(uint)(auVar127._8_4_ == iVar44);
              auVar106._12_4_ = -(uint)(auVar127._12_4_ == iVar83);
              auVar133._4_4_ = auVar106._4_4_;
              auVar133._0_4_ = auVar106._4_4_;
              auVar133._8_4_ = auVar106._12_4_;
              auVar133._12_4_ = auVar106._12_4_;
              auVar127 = pshuflw(auVar106,auVar133,0xe8);
              auVar134._4_4_ = auVar117._4_4_;
              auVar134._0_4_ = auVar117._4_4_;
              auVar134._8_4_ = auVar117._12_4_;
              auVar134._12_4_ = auVar117._12_4_;
              auVar104 = pshuflw(auVar117,auVar134,0xe8);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 & auVar129,(auVar104 | auVar127 & auVar129) ^ auVar11);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                local_4036[uVar67 * 2 + lVar57 + 9] = 0;
              }
              auVar22._4_4_ = auVar117._0_4_;
              auVar22._0_4_ = auVar117._0_4_;
              auVar22._8_4_ = auVar117._8_4_;
              auVar22._12_4_ = auVar117._8_4_;
              auVar134 = auVar133 & auVar22 | auVar134;
              auVar104 = packssdw(auVar134,auVar134);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127,auVar104 ^ auVar12);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._4_2_ >> 8 & 1) != 0) {
                local_4036[uVar67 * 2 + lVar57 + 0xb] = 0;
              }
              auVar127 = (auVar125 | _DAT_0017f170) ^ _DAT_00178d70;
              auVar118._0_4_ = -(uint)(iVar43 < auVar127._0_4_);
              auVar118._4_4_ = -(uint)(iVar84 < auVar127._4_4_);
              auVar118._8_4_ = -(uint)(iVar44 < auVar127._8_4_);
              auVar118._12_4_ = -(uint)(iVar83 < auVar127._12_4_);
              auVar135._4_4_ = auVar118._0_4_;
              auVar135._0_4_ = auVar118._0_4_;
              auVar135._8_4_ = auVar118._8_4_;
              auVar135._12_4_ = auVar118._8_4_;
              iVar87 = -(uint)(auVar127._4_4_ == iVar84);
              iVar46 = -(uint)(auVar127._12_4_ == iVar83);
              auVar23._4_4_ = iVar87;
              auVar23._0_4_ = iVar87;
              auVar23._8_4_ = iVar46;
              auVar23._12_4_ = iVar46;
              auVar143._4_4_ = auVar118._4_4_;
              auVar143._0_4_ = auVar118._4_4_;
              auVar143._8_4_ = auVar118._12_4_;
              auVar143._12_4_ = auVar118._12_4_;
              auVar127 = auVar23 & auVar135 | auVar143;
              auVar127 = packssdw(auVar127,auVar127);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 ^ auVar13,auVar127 ^ auVar13);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                local_4036[uVar67 * 2 + lVar57 + 0xd] = 0;
              }
              auVar127 = pshufhw(auVar127,auVar135,0x84);
              auVar24._4_4_ = iVar87;
              auVar24._0_4_ = iVar87;
              auVar24._8_4_ = iVar46;
              auVar24._12_4_ = iVar46;
              auVar129 = pshufhw(auVar118,auVar24,0x84);
              auVar104 = pshufhw(auVar127,auVar143,0x84);
              auVar107._8_4_ = 0xffffffff;
              auVar107._0_8_ = 0xffffffffffffffff;
              auVar107._12_4_ = 0xffffffff;
              auVar107 = (auVar104 | auVar129 & auVar127) ^ auVar107;
              auVar127 = packssdw(auVar107,auVar107);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._6_2_ >> 8 & 1) != 0) {
                local_4036[uVar67 * 2 + lVar57 + 0xf] = 0;
              }
              auVar127 = (auVar125 | _DAT_0017f230) ^ _DAT_00178d70;
              auVar119._0_4_ = -(uint)(iVar43 < auVar127._0_4_);
              auVar119._4_4_ = -(uint)(iVar84 < auVar127._4_4_);
              auVar119._8_4_ = -(uint)(iVar44 < auVar127._8_4_);
              auVar119._12_4_ = -(uint)(iVar83 < auVar127._12_4_);
              auVar25._4_4_ = auVar119._0_4_;
              auVar25._0_4_ = auVar119._0_4_;
              auVar25._8_4_ = auVar119._8_4_;
              auVar25._12_4_ = auVar119._8_4_;
              auVar129 = pshuflw(auVar143,auVar25,0xe8);
              auVar108._0_4_ = -(uint)(auVar127._0_4_ == iVar43);
              auVar108._4_4_ = -(uint)(auVar127._4_4_ == iVar84);
              auVar108._8_4_ = -(uint)(auVar127._8_4_ == iVar44);
              auVar108._12_4_ = -(uint)(auVar127._12_4_ == iVar83);
              auVar136._4_4_ = auVar108._4_4_;
              auVar136._0_4_ = auVar108._4_4_;
              auVar136._8_4_ = auVar108._12_4_;
              auVar136._12_4_ = auVar108._12_4_;
              auVar127 = pshuflw(auVar108,auVar136,0xe8);
              auVar137._4_4_ = auVar119._4_4_;
              auVar137._0_4_ = auVar119._4_4_;
              auVar137._8_4_ = auVar119._12_4_;
              auVar137._12_4_ = auVar119._12_4_;
              auVar104 = pshuflw(auVar119,auVar137,0xe8);
              auVar120._8_4_ = 0xffffffff;
              auVar120._0_8_ = 0xffffffffffffffff;
              auVar120._12_4_ = 0xffffffff;
              auVar120 = (auVar104 | auVar127 & auVar129) ^ auVar120;
              auVar104 = packssdw(auVar120,auVar120);
              auVar127 = packsswb(auVar127 & auVar129,auVar104);
              if ((auVar127 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                local_4036[uVar67 * 2 + lVar57 + 0x11] = 0;
              }
              auVar26._4_4_ = auVar119._0_4_;
              auVar26._0_4_ = auVar119._0_4_;
              auVar26._8_4_ = auVar119._8_4_;
              auVar26._12_4_ = auVar119._8_4_;
              auVar137 = auVar136 & auVar26 | auVar137;
              auVar104 = packssdw(auVar137,auVar137);
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar104 = packssdw(auVar104 ^ auVar14,auVar104 ^ auVar14);
              auVar127 = packsswb(auVar127,auVar104);
              if ((auVar127._8_2_ >> 8 & 1) != 0) {
                local_4036[uVar67 * 2 + lVar57 + 0x13] = 0;
              }
              auVar127 = (auVar125 | _DAT_0017f220) ^ _DAT_00178d70;
              auVar121._0_4_ = -(uint)(iVar43 < auVar127._0_4_);
              auVar121._4_4_ = -(uint)(iVar84 < auVar127._4_4_);
              auVar121._8_4_ = -(uint)(iVar44 < auVar127._8_4_);
              auVar121._12_4_ = -(uint)(iVar83 < auVar127._12_4_);
              auVar138._4_4_ = auVar121._0_4_;
              auVar138._0_4_ = auVar121._0_4_;
              auVar138._8_4_ = auVar121._8_4_;
              auVar138._12_4_ = auVar121._8_4_;
              iVar87 = -(uint)(auVar127._4_4_ == iVar84);
              iVar46 = -(uint)(auVar127._12_4_ == iVar83);
              auVar27._4_4_ = iVar87;
              auVar27._0_4_ = iVar87;
              auVar27._8_4_ = iVar46;
              auVar27._12_4_ = iVar46;
              auVar144._4_4_ = auVar121._4_4_;
              auVar144._0_4_ = auVar121._4_4_;
              auVar144._8_4_ = auVar121._12_4_;
              auVar144._12_4_ = auVar121._12_4_;
              auVar127 = auVar27 & auVar138 | auVar144;
              auVar127 = packssdw(auVar127,auVar127);
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 ^ auVar15,auVar127 ^ auVar15);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                local_4036[uVar67 * 2 + lVar57 + 0x15] = 0;
              }
              auVar127 = pshufhw(auVar127,auVar138,0x84);
              auVar28._4_4_ = iVar87;
              auVar28._0_4_ = iVar87;
              auVar28._8_4_ = iVar46;
              auVar28._12_4_ = iVar46;
              auVar129 = pshufhw(auVar121,auVar28,0x84);
              auVar104 = pshufhw(auVar127,auVar144,0x84);
              auVar109._8_4_ = 0xffffffff;
              auVar109._0_8_ = 0xffffffffffffffff;
              auVar109._12_4_ = 0xffffffff;
              auVar109 = (auVar104 | auVar129 & auVar127) ^ auVar109;
              auVar127 = packssdw(auVar109,auVar109);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._10_2_ >> 8 & 1) != 0) {
                local_4036[uVar67 * 2 + lVar57 + 0x17] = 0;
              }
              auVar127 = (auVar125 | _DAT_0017f210) ^ _DAT_00178d70;
              auVar122._0_4_ = -(uint)(iVar43 < auVar127._0_4_);
              auVar122._4_4_ = -(uint)(iVar84 < auVar127._4_4_);
              auVar122._8_4_ = -(uint)(iVar44 < auVar127._8_4_);
              auVar122._12_4_ = -(uint)(iVar83 < auVar127._12_4_);
              auVar29._4_4_ = auVar122._0_4_;
              auVar29._0_4_ = auVar122._0_4_;
              auVar29._8_4_ = auVar122._8_4_;
              auVar29._12_4_ = auVar122._8_4_;
              auVar129 = pshuflw(auVar144,auVar29,0xe8);
              auVar110._0_4_ = -(uint)(auVar127._0_4_ == iVar43);
              auVar110._4_4_ = -(uint)(auVar127._4_4_ == iVar84);
              auVar110._8_4_ = -(uint)(auVar127._8_4_ == iVar44);
              auVar110._12_4_ = -(uint)(auVar127._12_4_ == iVar83);
              auVar139._4_4_ = auVar110._4_4_;
              auVar139._0_4_ = auVar110._4_4_;
              auVar139._8_4_ = auVar110._12_4_;
              auVar139._12_4_ = auVar110._12_4_;
              auVar127 = pshuflw(auVar110,auVar139,0xe8);
              auVar140._4_4_ = auVar122._4_4_;
              auVar140._0_4_ = auVar122._4_4_;
              auVar140._8_4_ = auVar122._12_4_;
              auVar140._12_4_ = auVar122._12_4_;
              auVar104 = pshuflw(auVar122,auVar140,0xe8);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0xffffffffffffffff;
              auVar16._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 & auVar129,(auVar104 | auVar127 & auVar129) ^ auVar16);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                local_4036[uVar67 * 2 + lVar57 + 0x19] = 0;
              }
              auVar30._4_4_ = auVar122._0_4_;
              auVar30._0_4_ = auVar122._0_4_;
              auVar30._8_4_ = auVar122._8_4_;
              auVar30._12_4_ = auVar122._8_4_;
              auVar140 = auVar139 & auVar30 | auVar140;
              auVar104 = packssdw(auVar140,auVar140);
              auVar17._8_4_ = 0xffffffff;
              auVar17._0_8_ = 0xffffffffffffffff;
              auVar17._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127,auVar104 ^ auVar17);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127._12_2_ >> 8 & 1) != 0) {
                local_4036[uVar67 * 2 + lVar57 + 0x1b] = 0;
              }
              auVar127 = (auVar125 | _DAT_0017f200) ^ _DAT_00178d70;
              auVar111._0_4_ = -(uint)(iVar43 < auVar127._0_4_);
              auVar111._4_4_ = -(uint)(iVar84 < auVar127._4_4_);
              auVar111._8_4_ = -(uint)(iVar44 < auVar127._8_4_);
              auVar111._12_4_ = -(uint)(iVar83 < auVar127._12_4_);
              auVar141._4_4_ = auVar111._0_4_;
              auVar141._0_4_ = auVar111._0_4_;
              auVar141._8_4_ = auVar111._8_4_;
              auVar141._12_4_ = auVar111._8_4_;
              auVar126._4_4_ = -(uint)(auVar127._4_4_ == iVar84);
              auVar126._12_4_ = -(uint)(auVar127._12_4_ == iVar83);
              auVar126._0_4_ = auVar126._4_4_;
              auVar126._8_4_ = auVar126._12_4_;
              auVar128._4_4_ = auVar111._4_4_;
              auVar128._0_4_ = auVar111._4_4_;
              auVar128._8_4_ = auVar111._12_4_;
              auVar128._12_4_ = auVar111._12_4_;
              auVar104 = auVar126 & auVar141 | auVar128;
              auVar127 = packssdw(auVar111,auVar104);
              auVar18._8_4_ = 0xffffffff;
              auVar18._0_8_ = 0xffffffffffffffff;
              auVar18._12_4_ = 0xffffffff;
              auVar127 = packssdw(auVar127 ^ auVar18,auVar127 ^ auVar18);
              auVar127 = packsswb(auVar127,auVar127);
              if ((auVar127 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                local_4036[uVar67 * 2 + lVar57 + 0x1d] = 0;
              }
              auVar127 = pshufhw(auVar127,auVar141,0x84);
              in_XMM2 = pshufhw(auVar104,auVar126,0x84);
              in_XMM2 = in_XMM2 & auVar127;
              auVar127 = pshufhw(auVar127,auVar128,0x84);
              auVar112._8_4_ = 0xffffffff;
              auVar112._0_8_ = 0xffffffffffffffff;
              auVar112._12_4_ = 0xffffffff;
              auVar112 = (auVar127 | in_XMM2) ^ auVar112;
              auVar127 = packssdw(auVar112,auVar112);
              in_XMM1 = packsswb(auVar127,auVar127);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                local_4036[uVar67 * 2 + lVar57 + 0x1f] = 0;
              }
              uVar67 = uVar67 + 0x10;
            } while ((lVar58 + 0xfU & 0xfffffffffffffff0) != uVar67);
          }
          lVar57 = 0;
          memset(local_3420,0,0x1200);
          local_4350 = dec->qmf_state;
          uVar77 = 0;
          uVar67 = local_4368;
          do {
            bVar42 = local_4038;
            local_4378 = (ma_uint8 *)uVar77;
            uVar56 = local_4358->layer;
            uVar86 = (ulong)local_4038;
            uVar81 = (uint)local_4038;
            uVar82 = (ulong)uVar56 | 1;
            iVar43 = 0x240;
            lVar58 = 0;
            local_4368 = uVar67;
            bVar76 = local_4038;
            do {
              if (bVar76 == 0) {
                bVar76 = 0;
              }
              else {
                pfVar60 = local_3420 + (long)(int)uVar77 + lVar58 * ((long)(int)uVar56 | 1U);
                lVar51 = 0;
                do {
                  bVar76 = local_4036[lVar51];
                  if (bVar76 != 0) {
                    if (bVar76 < 0x11) {
                      if (-1 < (int)uVar56) {
                        uVar67 = 0;
                        do {
                          mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,(uint)bVar76);
                          pfVar60[uVar67] = (float)(int)(mVar48 + (-1 << (bVar76 - 1 & 0x1f)) + 1);
                          uVar67 = uVar67 + 1;
                        } while (uVar82 != uVar67);
                      }
                    }
                    else {
                      uVar79 = 2 << (bVar76 - 0x11 & 0x1f);
                      mVar48 = ma_dr_mp3_bs_get_bits(&local_4398,(uVar79 - (uVar79 >> 3)) + 3);
                      if (-1 < (int)uVar56) {
                        uVar67 = 0;
                        do {
                          pfVar60[uVar67] = (float)(int)(mVar48 % (uVar79 + 1) - (uVar79 >> 1));
                          uVar67 = uVar67 + 1;
                          mVar48 = mVar48 / (uVar79 + 1);
                        } while (uVar82 != uVar67);
                      }
                    }
                  }
                  pfVar60 = pfVar60 + iVar43;
                  iVar43 = 0x12 - iVar43;
                  lVar51 = lVar51 + 1;
                  uVar67 = local_4368;
                  bVar76 = bVar42;
                } while (lVar51 != (ulong)(uVar81 * 2) + (ulong)((ulong)(uVar81 * 2) == 0));
              }
              lVar58 = lVar58 + 1;
            } while (lVar58 != 4);
            uVar56 = (int)local_4378 + (int)uVar82 * 4;
            uVar77 = (ulong)uVar56;
            if (uVar56 == 0xc) {
              memcpy(local_2b20 + (uint)local_4037 * 0x48,
                     (void *)((ulong)((uint)local_4037 * 0x48) + (long)local_3420),
                     (uVar86 - local_4037) * 0x48);
              pmVar40 = local_4360;
              if (bVar42 != 0) {
                pfVar73 = (float *)(&local_4338 + lVar57);
                uVar56 = 0;
                pfVar60 = local_3420;
                do {
                  fVar92 = *pfVar73;
                  fVar95 = pfVar73[3];
                  lVar58 = 0;
                  do {
                    pfVar64 = pfVar60 + lVar58;
                    fVar96 = pfVar64[1];
                    fVar31 = pfVar64[2];
                    fVar32 = pfVar64[3];
                    pfVar59 = pfVar60 + lVar58;
                    *pfVar59 = *pfVar64 * fVar92;
                    pfVar59[1] = fVar96 * fVar92;
                    pfVar59[2] = fVar31 * fVar92;
                    pfVar59[3] = fVar32 * fVar92;
                    pfVar64 = pfVar60 + lVar58 + 0x240;
                    auVar123._0_4_ = *pfVar64 * fVar95;
                    auVar123._4_4_ = pfVar64[1] * fVar95;
                    auVar123._8_4_ = pfVar64[2] * fVar95;
                    auVar123._12_4_ = pfVar64[3] * fVar95;
                    *(undefined1 (*) [16])(pfVar60 + lVar58 + 0x240) = auVar123;
                    lVar58 = lVar58 + 4;
                  } while (lVar58 != 0xc);
                  uVar56 = uVar56 + 1;
                  pfVar60 = pfVar60 + 0x12;
                  pfVar73 = pfVar73 + 6;
                } while (uVar56 != bVar42);
              }
              ma_dr_mp3d_synth_granule
                        (local_4350,local_3420,0xc,(int)local_4368,local_4360,local_2180);
              uVar77 = 0;
              memset(local_3420,0,0x1200);
              uVar67 = (ulong)local_4358->channels;
              local_4360 = pmVar40 + uVar67 * 0x180;
            }
            if (local_4398.limit < local_4398.pos) goto LAB_00158b97;
            lVar57 = lVar57 + 1;
          } while (lVar57 != 3);
          uVar56 = 1;
        }
        uVar81 = 0x180;
        if ((~dec->header[1] & 6) != 0) {
          uVar81 = 0x480 >> ((dec->header[1] & 0xe) == 2);
        }
        return uVar81 * uVar56;
      }
    }
    pmVar50 = local_4380;
    memset(dec,0,0x1a0c);
    iVar84 = 8;
    uVar67 = 0;
    do {
      iVar43 = ma_dr_mp3_hdr_valid(pmVar50);
      if (iVar43 != 0) {
        bVar76 = pmVar50[1];
        bVar55 = pmVar50[2];
        bVar91 = false;
        iVar43 = ma_dr_mp3_hdr_frame_bytes((ma_uint8 *)(ulong)bVar76,(uint)bVar55);
        iVar44 = (uint)((~bVar76 & 6) == 0) * 3 + 1;
        if ((bVar55 & 2) == 0) {
          iVar44 = 0;
        }
        local_43d8 = (ulong)(uint)(iVar44 + iVar43);
        uVar56 = iVar44 + iVar43;
        if (iVar43 == 0) {
          uVar77 = 4;
          iVar43 = iVar84;
          do {
            if ((int)(mp3_bytes - 4U) <= iVar43) goto LAB_00158612;
            iVar44 = ma_dr_mp3_hdr_compare(pmVar50,pmVar50 + uVar77);
            if (iVar44 == 0) {
LAB_001585b4:
              iVar83 = 0;
            }
            else {
              iVar44 = 0;
              uVar56 = 0;
              if ((pmVar50[2] & 2) != 0) {
                uVar56 = -(uint)((~pmVar50[1] & 6) != 0) | 0xfffffffc;
              }
              if ((pmVar50[uVar77 + 2] & 2) != 0) {
                iVar44 = (uint)((~pmVar50[uVar77 + 1] & 6) == 0) * 3 + 1;
              }
              iVar83 = 0;
              if (mp3_bytes < (int)(iVar43 + iVar44 + uVar56 + 4)) goto LAB_001585b4;
              iVar44 = ma_dr_mp3_hdr_compare
                                 (pmVar50,pmVar50 + uVar77 + (iVar44 + uVar56 + (int)uVar77));
              if (iVar44 != 0) {
                iVar83 = uVar56 + (int)uVar77;
                dec->free_format_bytes = iVar83;
                local_43d8 = uVar77 & 0xffffffff;
              }
            }
            bVar91 = iVar83 == 0;
            uVar56 = (uint)local_43d8;
            if (0x8fe < uVar77) break;
            uVar77 = uVar77 + 1;
            iVar43 = iVar43 + 2;
          } while (iVar83 == 0);
        }
        local_43d8._0_4_ = uVar56;
        if (!bVar91) {
          iVar43 = (int)uVar67;
          iVar44 = iVar43 + (uint)local_43d8;
          if (iVar44 <= mp3_bytes) {
            iVar83 = 0;
            iVar87 = 0;
            while( true ) {
              bVar76 = pmVar50[(long)iVar87 + 1];
              bVar55 = pmVar50[(long)iVar87 + 2];
              iVar45 = ma_dr_mp3_hdr_frame_bytes((ma_uint8 *)(ulong)bVar76,(uint)bVar55);
              iVar46 = (uint)((~bVar76 & 6) == 0) * 3 + 1;
              if ((bVar55 & 2) == 0) {
                iVar46 = 0;
              }
              if ((long)((uint)mp3_bytes - uVar67) < (long)(iVar46 + iVar87 + iVar45 + 4)) break;
              iVar87 = iVar87 + iVar45 + iVar46;
              iVar46 = ma_dr_mp3_hdr_compare(pmVar50,pmVar50 + iVar87);
              if (iVar46 == 0) goto LAB_00158612;
              iVar83 = iVar83 + -1;
              if (iVar83 == -10) goto LAB_00158683;
            }
            if (iVar83 != 0) goto LAB_00158bf4;
          }
        }
LAB_00158612:
        if ((uVar67 == 0) && ((uint)local_43d8 == mp3_bytes)) {
          uVar67 = 0;
          local_43d8._0_4_ = mp3_bytes;
LAB_00158bf4:
          iVar43 = (int)uVar67;
          iVar44 = iVar43 + (uint)local_43d8;
LAB_00158683:
          if (((uint)local_43d8 != 0) && (iVar44 <= mp3_bytes)) goto LAB_001586ff;
          break;
        }
        dec->free_format_bytes = 0;
      }
      uVar67 = uVar67 + 1;
      pmVar50 = pmVar50 + 1;
      iVar84 = iVar84 + 1;
      iVar43 = mp3_bytes;
    } while (uVar67 != mp3_bytes - 4U);
  }
  local_4358->frame_bytes = iVar43;
  return 0;
LAB_001596d0:
  local_3fb0.pos = (uint)local_43a8;
  pmVar50 = local_4370 + 1;
  if ((float *)pmVar50 == local_4350) goto LAB_001596f5;
  goto LAB_00158dd9;
}

Assistant:

MA_API int ma_dr_mp3dec_decode_frame(ma_dr_mp3dec *dec, const ma_uint8 *mp3, int mp3_bytes, void *pcm, ma_dr_mp3dec_frame_info *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const ma_uint8 *hdr;
    ma_dr_mp3_bs bs_frame[1];
    ma_dr_mp3dec_scratch scratch;
    if (mp3_bytes > 4 && dec->header[0] == 0xff && ma_dr_mp3_hdr_compare(dec->header, mp3))
    {
        frame_size = ma_dr_mp3_hdr_frame_bytes(mp3, dec->free_format_bytes) + ma_dr_mp3_hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + MA_DR_MP3_HDR_SIZE > mp3_bytes || !ma_dr_mp3_hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        MA_DR_MP3_ZERO_MEMORY(dec, sizeof(ma_dr_mp3dec));
        i = ma_dr_mp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }
    hdr = mp3 + i;
    MA_DR_MP3_COPY_MEMORY(dec->header, hdr, MA_DR_MP3_HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->channels = MA_DR_MP3_HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = ma_dr_mp3_hdr_sample_rate_hz(hdr);
    info->layer = 4 - MA_DR_MP3_HDR_GET_LAYER(hdr);
    info->bitrate_kbps = ma_dr_mp3_hdr_bitrate_kbps(hdr);
    ma_dr_mp3_bs_init(bs_frame, hdr + MA_DR_MP3_HDR_SIZE, frame_size - MA_DR_MP3_HDR_SIZE);
    if (MA_DR_MP3_HDR_IS_CRC(hdr))
    {
        ma_dr_mp3_bs_get_bits(bs_frame, 16);
    }
    if (info->layer == 3)
    {
        int main_data_begin = ma_dr_mp3_L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            ma_dr_mp3dec_init(dec);
            return 0;
        }
        success = ma_dr_mp3_L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success && pcm != NULL)
        {
            for (igr = 0; igr < (MA_DR_MP3_HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm = MA_DR_MP3_OFFSET_PTR(pcm, sizeof(ma_dr_mp3d_sample_t)*576*info->channels))
            {
                MA_DR_MP3_ZERO_MEMORY(scratch.grbuf[0], 576*2*sizeof(float));
                ma_dr_mp3_L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                ma_dr_mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, (ma_dr_mp3d_sample_t*)pcm, scratch.syn[0]);
            }
        }
        ma_dr_mp3_L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef MA_DR_MP3_ONLY_MP3
        return 0;
#else
        ma_dr_mp3_L12_scale_info sci[1];
        if (pcm == NULL) {
            return ma_dr_mp3_hdr_frame_samples(hdr);
        }
        ma_dr_mp3_L12_read_scale_info(hdr, bs_frame, sci);
        MA_DR_MP3_ZERO_MEMORY(scratch.grbuf[0], 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += ma_dr_mp3_L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                ma_dr_mp3_L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                ma_dr_mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, (ma_dr_mp3d_sample_t*)pcm, scratch.syn[0]);
                MA_DR_MP3_ZERO_MEMORY(scratch.grbuf[0], 576*2*sizeof(float));
                pcm = MA_DR_MP3_OFFSET_PTR(pcm, sizeof(ma_dr_mp3d_sample_t)*384*info->channels);
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                ma_dr_mp3dec_init(dec);
                return 0;
            }
        }
#endif
    }
    return success*ma_dr_mp3_hdr_frame_samples(dec->header);
}